

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse2_128_64.c
# Opt level: O1

parasail_result_t *
parasail_nw_table_striped_profile_sse2_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  parasail_result_t *ppVar9;
  __m128i *ptr;
  __m128i *palVar10;
  __m128i *ptr_00;
  int64_t *ptr_01;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  ulong size;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  int32_t segNum;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  __m128i *ptr_02;
  int iVar30;
  long lVar31;
  bool bVar32;
  longlong lVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  __m128i_64_t B;
  undefined1 auVar41 [16];
  int64_t iVar42;
  long lVar43;
  __m128i_64_t B_2;
  long lVar45;
  undefined1 auVar44 [16];
  long lVar46;
  long lVar47;
  long lVar48;
  __m128i_64_t e;
  __m128i_64_t h;
  longlong local_58 [5];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_table_striped_profile_sse2_128_64_cold_8();
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      parasail_nw_table_striped_profile_sse2_128_64_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_nw_table_striped_profile_sse2_128_64_cold_6();
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          parasail_nw_table_striped_profile_sse2_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_table_striped_profile_sse2_128_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_table_striped_profile_sse2_128_64_cold_3();
        }
        else if (open < 0) {
          parasail_nw_table_striped_profile_sse2_128_64_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_table_striped_profile_sse2_128_64_cold_1();
        }
        else {
          iVar6 = uVar2 - 1;
          size = (ulong)uVar2 + 1 >> 1;
          iVar18 = (int)size;
          uVar13 = (ulong)(uint)open;
          iVar30 = -open;
          iVar8 = ppVar4->min;
          uVar29 = 0x8000000000000000 - (long)iVar8;
          if (iVar8 != iVar30 && SBORROW4(iVar8,iVar30) == iVar8 + open < 0) {
            uVar29 = uVar13 | 0x8000000000000000;
          }
          iVar8 = ppVar4->max;
          ppVar9 = parasail_result_new_table1((uint)((ulong)uVar2 + 1) & 0x7ffffffe,s2Len);
          if (ppVar9 != (parasail_result_t *)0x0) {
            ppVar9->flag = ppVar9->flag | 0x2820801;
            ptr = parasail_memalign___m128i(0x10,size);
            palVar10 = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign___m128i(0x10,size);
            ptr_01 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
            if ((ptr_01 != (int64_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                (palVar10 != (__m128i *)0x0 && ptr != (__m128i *)0x0)) {
              iVar7 = s2Len + -1;
              uVar34 = (ulong)(uint)gap;
              lVar11 = uVar29 + 1;
              lVar14 = 0x7ffffffffffffffe - (long)iVar8;
              auVar36._8_4_ = (int)lVar11;
              auVar36._0_8_ = lVar11;
              auVar36._12_4_ = (int)((ulong)lVar11 >> 0x20);
              auVar38._8_4_ = (int)lVar14;
              auVar38._0_8_ = lVar14;
              auVar38._12_4_ = (int)((ulong)lVar14 >> 0x20);
              uVar15 = (ulong)(uint)gap;
              lVar11 = (long)iVar30;
              uVar22 = 0;
              do {
                lVar25 = 0;
                lVar23 = lVar11;
                do {
                  local_58[lVar25 + 2] = lVar23;
                  local_58[lVar25] = lVar23 - uVar13;
                  lVar25 = lVar25 + 1;
                  lVar23 = lVar23 - size * uVar15;
                } while (lVar25 == 1);
                ptr[uVar22][0] = local_58[2];
                ptr[uVar22][1] = local_58[3];
                ptr_00[uVar22][0] = local_58[0];
                ptr_00[uVar22][1] = local_58[1];
                uVar22 = uVar22 + 1;
                lVar11 = lVar11 - uVar15;
              } while (uVar22 != size);
              *ptr_01 = 0;
              lVar11 = (long)iVar30;
              uVar22 = 1;
              do {
                ptr_01[uVar22] = lVar11;
                uVar22 = uVar22 + 1;
                lVar11 = lVar11 - uVar15;
              } while (s2Len + 1 != uVar22);
              uVar15 = 1;
              if (1 < s2Len) {
                uVar15 = (ulong)(uint)s2Len;
              }
              lVar11 = size * (uint)s2Len * 4;
              lVar23 = (ulong)(uint)s2Len * 4;
              lVar25 = (ulong)(iVar18 + (uint)(iVar18 == 0)) << 4;
              lVar20 = 0;
              uVar22 = 0;
              auVar40 = auVar36;
              do {
                ptr_02 = ptr;
                ptr = palVar10;
                iVar8 = ppVar4->mapper[(byte)s2[uVar22]];
                iVar42 = ptr_01[uVar22];
                lVar33 = ptr_02[iVar18 - 1][0];
                lVar24 = 0;
                lVar16 = lVar20;
                auVar41 = auVar36;
                do {
                  plVar1 = (long *)((long)pvVar3 + lVar24 + (long)iVar8 * (long)iVar18 * 0x10);
                  lVar43 = iVar42 + *plVar1;
                  lVar45 = lVar33 + plVar1[1];
                  lVar46 = *(long *)((long)*ptr_00 + lVar24);
                  lVar47 = *(long *)((long)*ptr_00 + lVar24 + 8);
                  if (lVar43 <= lVar46) {
                    lVar43 = lVar46;
                  }
                  if (lVar45 <= lVar47) {
                    lVar45 = lVar47;
                  }
                  lVar27 = auVar41._0_8_;
                  if (lVar43 <= lVar27) {
                    lVar43 = lVar27;
                  }
                  lVar31 = auVar41._8_8_;
                  if (lVar45 <= lVar31) {
                    lVar45 = lVar31;
                  }
                  lVar19 = auVar40._0_8_;
                  if (auVar40._0_8_ <= lVar43) {
                    lVar19 = lVar43;
                  }
                  lVar17 = auVar40._8_8_;
                  if (auVar40._8_8_ <= lVar45) {
                    lVar17 = lVar45;
                  }
                  lVar21 = auVar38._0_8_;
                  if (lVar43 <= auVar38._0_8_) {
                    lVar21 = lVar43;
                  }
                  lVar26 = auVar38._8_8_;
                  if (lVar45 <= auVar38._8_8_) {
                    lVar26 = lVar45;
                  }
                  if (lVar46 <= lVar21) {
                    lVar21 = lVar46;
                  }
                  if (lVar47 <= lVar26) {
                    lVar26 = lVar47;
                  }
                  if (lVar27 <= lVar21) {
                    lVar21 = lVar27;
                  }
                  plVar1 = (long *)((long)*ptr_00 + lVar24);
                  lVar46 = *plVar1;
                  lVar47 = plVar1[1];
                  plVar1 = (long *)((long)*ptr + lVar24);
                  *plVar1 = lVar43;
                  plVar1[1] = lVar45;
                  if (lVar31 <= lVar26) {
                    lVar26 = lVar31;
                  }
                  piVar5 = ((ppVar9->field_4).rowcols)->score_row;
                  *(int *)((long)piVar5 + lVar16) = (int)lVar43;
                  lVar43 = lVar43 - uVar13;
                  lVar48 = lVar45 - (ulong)(uint)open;
                  lVar46 = lVar46 - uVar34;
                  uVar35 = (ulong)(uint)gap;
                  lVar47 = lVar47 - uVar35;
                  if (lVar46 <= lVar43) {
                    lVar46 = lVar43;
                  }
                  *(int *)((long)piVar5 + lVar11 + lVar16) = (int)lVar45;
                  if (lVar47 <= lVar48) {
                    lVar47 = lVar48;
                  }
                  if (lVar43 < (long)(lVar27 - uVar34)) {
                    lVar43 = lVar27 - uVar34;
                  }
                  if (lVar48 < (long)(lVar31 - uVar35)) {
                    lVar48 = lVar31 - uVar35;
                  }
                  auVar40._8_8_ = lVar17;
                  auVar40._0_8_ = lVar19;
                  auVar38._8_8_ = lVar26;
                  auVar38._0_8_ = lVar21;
                  plVar1 = (long *)((long)*ptr_00 + lVar24);
                  *plVar1 = lVar46;
                  plVar1[1] = lVar47;
                  auVar41._8_8_ = lVar48;
                  auVar41._0_8_ = lVar43;
                  plVar1 = (long *)((long)*ptr_02 + lVar24);
                  iVar42 = *plVar1;
                  lVar33 = plVar1[1];
                  lVar24 = lVar24 + 0x10;
                  lVar16 = lVar16 + lVar23;
                } while (lVar25 != lVar24);
                iVar8 = 0;
                do {
                  auVar41._8_8_ = auVar41._0_8_;
                  auVar41._0_8_ = ptr_01[uVar22 + 1] - uVar13;
                  bVar32 = true;
                  uVar12 = 1;
                  lVar24 = 0;
                  lVar16 = lVar20;
                  do {
                    lVar45 = auVar41._0_8_;
                    lVar46 = *(long *)((long)*ptr + lVar24);
                    lVar47 = lVar45;
                    if (lVar45 < lVar46) {
                      lVar47 = lVar46;
                    }
                    lVar46 = *(long *)((long)*ptr + lVar24 + 8);
                    lVar27 = auVar41._8_8_;
                    lVar43 = lVar27;
                    if (lVar27 < lVar46) {
                      lVar43 = lVar46;
                    }
                    plVar1 = (long *)((long)*ptr + lVar24);
                    *plVar1 = lVar47;
                    plVar1[1] = lVar43;
                    lVar46 = auVar38._0_8_;
                    if (lVar47 <= auVar38._0_8_) {
                      lVar46 = lVar47;
                    }
                    lVar31 = auVar38._8_8_;
                    if (lVar43 <= auVar38._8_8_) {
                      lVar31 = lVar43;
                    }
                    auVar38._8_8_ = lVar31;
                    auVar38._0_8_ = lVar46;
                    lVar19 = auVar40._0_8_;
                    if (auVar40._0_8_ <= lVar47) {
                      lVar19 = lVar47;
                    }
                    lVar17 = auVar40._8_8_;
                    if (auVar40._8_8_ <= lVar43) {
                      lVar17 = lVar43;
                    }
                    auVar40._8_8_ = lVar17;
                    auVar40._0_8_ = lVar19;
                    piVar5 = ((ppVar9->field_4).rowcols)->score_row;
                    *(int *)((long)piVar5 + lVar16) = (int)lVar47;
                    *(int *)((long)piVar5 + lVar11 + lVar16) = (int)lVar43;
                    auVar41._0_8_ = lVar45 - uVar34;
                    auVar41._8_8_ = lVar27 - uVar35;
                    uVar28 = -(ulong)((long)(lVar43 - (ulong)(uint)open) < auVar41._8_8_);
                    auVar44._8_8_ = uVar28;
                    auVar44._0_8_ = -(ulong)((long)(lVar47 - uVar13) < auVar41._0_8_);
                    if ((((((((((((((((auVar44 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar44 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar44 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar44 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar44 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar44 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar44 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar44 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (uVar28 >> 7 & 1) == 0) && (uVar28 >> 0xf & 1) == 0) &&
                            (uVar28 >> 0x17 & 1) == 0) && (uVar28 >> 0x1f & 1) == 0) &&
                          (uVar28 >> 0x27 & 1) == 0) && (uVar28 >> 0x2f & 1) == 0) &&
                        (uVar28 >> 0x37 & 1) == 0) && -1 < (long)uVar28) break;
                    bVar32 = uVar12 < size;
                    lVar24 = lVar24 + 0x10;
                    lVar16 = lVar16 + lVar23;
                    uVar12 = uVar12 + 1;
                  } while (lVar25 != lVar24);
                } while ((!bVar32) && (bVar32 = iVar8 == 0, iVar8 = iVar8 + 1, bVar32));
                uVar22 = uVar22 + 1;
                lVar20 = lVar20 + 4;
                palVar10 = ptr_02;
                if (uVar22 == uVar15) {
                  lVar33 = ptr[(uint)(iVar6 % iVar18)][0];
                  iVar8 = (int)ptr[(uint)(iVar6 % iVar18)][1];
                  if (iVar6 / iVar18 < 1) {
                    do {
                      iVar8 = (int)lVar33;
                      lVar33 = 0;
                    } while (iVar6 / iVar18 < 0);
                  }
                  auVar37._8_8_ = -(ulong)(lVar31 <= (long)uVar29);
                  auVar37._0_8_ = -(ulong)(lVar46 <= (long)uVar29);
                  auVar39._8_8_ = -(ulong)(lVar14 < lVar17);
                  auVar39._0_8_ = -(ulong)(lVar14 < lVar19);
                  auVar39 = auVar39 | auVar37;
                  if ((((((((((((((((auVar39 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar39 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar39 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar39 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar39 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar39 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar39 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar39 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar39 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar39 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar39 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar39 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar39 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar39[0xf] < '\0') {
                    *(byte *)&ppVar9->flag = (byte)ppVar9->flag | 0x40;
                    iVar8 = 0;
                    iVar7 = 0;
                    iVar6 = 0;
                  }
                  ppVar9->score = iVar8;
                  ppVar9->end_query = iVar6;
                  ppVar9->end_ref = iVar7;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr_02);
                  parasail_free(ptr);
                  return ppVar9;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}